

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O2

void __thiscall
lume::Neighborhoods::refresh
          (Neighborhoods *this,SPMesh *mesh,GrobSet grobTypes,Neighborhoods *grobConnections)

{
  ProfileMark peproMark_Neighborhoods__refresh;
  ProfileMark local_21;
  
  pepro::impl::ProfileMark::ProfileMark(&local_21,"Neighborhoods__refresh");
  std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>,
             &mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
  (this->m_centerGrobTypes).m_offset = grobTypes.m_offset;
  (this->m_neighborGrobTypes).m_offset = grobTypes.m_offset;
  (this->m_nbrs).m_tupleSize = 2;
  impl::FillNeighborMap<lume::ArrayAnnex<unsigned_int>>
            (&this->m_nbrs,&this->m_offsets,this->m_grobBaseInds,
             (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             grobTypes,grobConnections);
  pepro::impl::ProfileMark::~ProfileMark(&local_21);
  return;
}

Assistant:

void Neighborhoods::
refresh (SPMesh mesh, GrobSet grobTypes, const Neighborhoods& grobConnections)
{
	PEPRO_BEGIN(Neighborhoods__refresh);

	m_mesh = mesh;
	m_centerGrobTypes = grobTypes;
	m_neighborGrobTypes = grobTypes;

	m_nbrs.set_tuple_size (2);
	impl::FillNeighborMap (m_nbrs, m_offsets, m_grobBaseInds, *m_mesh,
	                       grobTypes, grobConnections);
}